

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemInterface::handleExtendedKeyEvent
               (QWindow *window,ulong timestamp,Type type,int key,KeyboardModifiers modifiers,
               quint32 nativeScanCode,quint32 nativeVirtualKey,quint32 nativeModifiers,QString *text
               ,bool autorep,ushort count)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined1 args_9;
  uint in_EDX;
  undefined8 in_RSI;
  unsigned_long in_RDI;
  long in_FS_OFFSET;
  uint in_stack_00000010;
  uint in_stack_00000018;
  undefined1 in_stack_00000020;
  undefined7 in_stack_00000021;
  unsigned_short in_stack_00000030;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QWindow *in_stack_ffffffffffffffc0;
  long lVar2;
  
  args_9 = (undefined1)((uint)in_ECX >> 0x18);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindowSystemInterface::DefaultDelivery,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
                    (in_stack_ffffffffffffffc0,in_RDI,(Type)((ulong)in_RSI >> 0x20),(int)in_RSI,
                     (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84((ulong)lVar2 >> 0x20,0),
                     in_EDX,in_stack_00000010,in_stack_00000018,
                     (QString *)CONCAT71(in_stack_00000021,in_stack_00000020),(bool)args_9,
                     in_stack_00000030);
  QString::~QString((QString *)0x43cf08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemInterface::handleExtendedKeyEvent(QWindow *window, ulong timestamp, QEvent::Type type, int key,
                                                    Qt::KeyboardModifiers modifiers,
                                                    quint32 nativeScanCode, quint32 nativeVirtualKey,
                                                    quint32 nativeModifiers,
                                                    const QString& text, bool autorep,
                                                    ushort count)
{
    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent>(window,
        timestamp, type, key, modifiers, nativeScanCode, nativeVirtualKey, nativeModifiers, text, autorep, count);
}